

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<std::__cxx11::string&,char*>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,char **args_1)

{
  format_args args_00;
  string_view fmt_00;
  char *s;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RDI;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_00000010;
  log_msg *in_stack_00000018;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  buffer<char> *in_stack_fffffffffffffb78;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  logger *in_stack_fffffffffffffb88;
  logger *in_stack_fffffffffffffb90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb98;
  unsigned_long_long in_stack_fffffffffffffbb8;
  buffer<char> *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  size_t in_stack_fffffffffffffbd0;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> out;
  level_enum lvl_00;
  log_msg *in_stack_fffffffffffffbf0;
  string_view_t in_stack_fffffffffffffbf8;
  string_view_t in_stack_fffffffffffffc08;
  source_loc in_stack_fffffffffffffc20;
  basic_string_view<char> local_378 [2];
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *pbStack_350;
  log_msg *local_348;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_2e0;
  undefined1 local_2d8 [32];
  undefined8 local_2b8;
  undefined1 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined1 local_271 [295];
  undefined1 local_14a;
  byte local_149;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 *local_40;
  undefined8 *local_38;
  undefined1 *local_30;
  undefined8 local_28;
  undefined8 *local_20;
  undefined1 *local_18;
  
  lvl_00 = (level_enum)((ulong)in_RDI >> 0x20);
  local_128 = in_RDX;
  uStack_120 = in_RCX;
  local_149 = should_log(in_stack_fffffffffffffb88,
                         (level_enum)((ulong)in_stack_fffffffffffffb80 >> 0x20));
  local_14a = details::backtracer::enabled((backtracer *)0x7a7983);
  if (((local_149 & 1) != 0) || ((bool)local_14a)) {
    out.container = (buffer<char> *)local_271;
    std::allocator<char>::allocator();
    ::fmt::v9::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffb80,(allocator<char> *)in_stack_fffffffffffffb78);
    std::allocator<char>::~allocator((allocator<char> *)local_271);
    ::fmt::v9::appender::back_insert_iterator
              ((appender *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    local_2a8 = local_128;
    uStack_2a0 = uStack_120;
    ::fmt::v9::
    make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&,char*&>
              (in_stack_fffffffffffffb98,(char **)in_stack_fffffffffffffb90);
    local_38 = &local_2b8;
    local_40 = local_2d8;
    local_28 = 0xcd;
    local_2b8 = 0xcd;
    fmt_00.data_._4_4_ = in_stack_fffffffffffffbcc;
    fmt_00.data_._0_4_ = in_stack_fffffffffffffbc8;
    fmt_00.size_ = in_stack_fffffffffffffbd0;
    args_00.field_1.values_ = in_stack_fffffffffffffbc0.values_;
    args_00.desc_ = in_stack_fffffffffffffbb8;
    local_30 = local_40;
    local_20 = local_38;
    local_18 = local_40;
    local_2b0 = local_40;
    local_2e0.container =
         (buffer<char> *)::fmt::v9::vformat_to<fmt::v9::appender,_0>(out.container,fmt_00,args_00);
    local_348 = in_stack_00000018;
    pbStack_350 = in_stack_00000010;
    ::fmt::v9::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffb80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb78);
    this_00 = (buffer<char> *)(local_271 + 1);
    s = ::fmt::v9::detail::buffer<char>::data(this_00);
    count = ::fmt::v9::detail::buffer<char>::size(this_00);
    ::fmt::v9::basic_string_view<char>::basic_string_view(local_378,s,count);
    details::log_msg::log_msg
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffc20,in_stack_fffffffffffffc08,lvl_00,
               in_stack_fffffffffffffbf8);
    log_it_(in_stack_fffffffffffffb90,local_348,SUB81((ulong)pbStack_350 >> 0x38,0),
            SUB81((ulong)pbStack_350 >> 0x30,0));
    ::fmt::v9::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              (pbStack_350);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }